

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::DynamicRectMatrix<double>::getColumn
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DynamicRectMatrix<double> *this,uint col)

{
  uint uVar1;
  double **ppdVar2;
  pointer pdVar3;
  ulong uVar4;
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,(ulong)this->ncol_,&local_19);
  uVar1 = this->nrow_;
  ppdVar2 = this->data_;
  pdVar3 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pdVar3[uVar4] = ppdVar2[uVar4][col];
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<Real> getColumn(unsigned int col) {
      DynamicVector<Real> v(ncol_);

      for (unsigned int j = 0; j < nrow_; j++)
        v[j] = this->data_[j][col];

      return v;
    }